

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_average.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::time_average
          (NavierStokesBase *this,Real *a_time_avg,Real *a_time_avg_fluct,Real *a_dt_avg,
          Real *dt_level)

{
  double dVar1;
  double dVar2;
  pointer pSVar3;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_02;
  int iVar4;
  int k;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int j;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  Real RVar30;
  double dVar31;
  Box local_16c;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  *a_dt_avg = *a_dt_avg + *dt_level;
  if (*(((this->super_AmrLevel).parent)->level_steps).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
      avg_interval == 0) {
    pSVar3 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (pSVar3->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         pSVar3[Average_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    this_02.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         pSVar3[Average_Type].old_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    amrex::MFIter::MFIter
              (&mfi,(FabArrayBase *)
                    this_01.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::tilebox(&local_16c,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,0);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,
                 (FabArray<amrex::FArrayBox> *)
                 this_01.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_150,
                 (FabArray<amrex::FArrayBox> *)
                 this_02.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
      iVar4 = compute_fluctuations;
      lVar26 = (long)local_16c.smallend.vect[1];
      lVar7 = (long)local_16c.smallend.vect[2];
      lVar5 = (long)local_16c.smallend.vect[0];
      lVar19 = local_110.kstride * 8;
      lVar9 = local_110.jstride * 8;
      lVar14 = (lVar26 - local_110.begin.y) * lVar9 + (lVar7 - local_110.begin.z) * lVar19 +
               lVar5 * 8;
      lVar20 = local_110.nstride * 0x18 + lVar14 + (long)local_110.begin.x * -8 + (long)local_110.p;
      lVar17 = lVar14 + (long)local_110.begin.x * -8 + (long)local_110.p;
      lVar11 = local_150.kstride * 8;
      lVar10 = local_150.jstride * 8;
      lVar14 = (lVar26 - local_150.begin.y) * lVar10 + (lVar7 - local_150.begin.z) * lVar11 +
               lVar5 * 8;
      lVar27 = local_150.nstride * 0x18 + lVar14 + (long)local_150.begin.x * -8 + (long)local_150.p;
      lVar23 = lVar14 + (long)local_150.begin.x * -8 + (long)local_150.p;
      dVar1 = *a_dt_avg;
      dVar2 = *a_time_avg;
      lVar5 = (lVar26 - local_d0.begin.y) * local_d0.jstride * 8 +
              (lVar7 - local_d0.begin.z) * local_d0.kstride * 8 + lVar5 * 8 +
              (long)local_d0.begin.x * -8 + (long)local_d0.p;
      for (lVar14 = 0; lVar6 = lVar7, lVar12 = lVar17, lVar15 = lVar5, lVar21 = lVar20,
          lVar24 = lVar23, lVar28 = lVar27, lVar14 != 3; lVar14 = lVar14 + 1) {
        for (; lVar8 = lVar15, lVar16 = lVar12, lVar18 = lVar24, lVar22 = lVar26, lVar25 = lVar28,
            lVar29 = lVar21, lVar6 <= local_16c.bigend.vect[2]; lVar6 = lVar6 + 1) {
          for (; lVar22 <= local_16c.bigend.vect[1]; lVar22 = lVar22 + 1) {
            if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
              lVar13 = 0;
              do {
                dVar31 = *(double *)(lVar8 + lVar13 * 8) * dVar1 + *(double *)(lVar18 + lVar13 * 8);
                *(double *)(lVar16 + lVar13 * 8) = dVar31;
                *(double *)(lVar18 + lVar13 * 8) = dVar31;
                dVar31 = 0.0;
                if (iVar4 == 1) {
                  dVar31 = *(double *)(lVar8 + lVar13 * 8) -
                           *(double *)(lVar16 + lVar13 * 8) / (dVar2 + dVar1);
                  dVar31 = dVar1 * dVar31 * dVar31 + *(double *)(lVar25 + lVar13 * 8);
                }
                *(double *)(lVar29 + lVar13 * 8) = dVar31;
                *(double *)(lVar25 + lVar13 * 8) = dVar31;
                lVar13 = lVar13 + 1;
              } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 != (int)lVar13);
            }
            lVar29 = lVar29 + lVar9;
            lVar16 = lVar16 + lVar9;
            lVar8 = lVar8 + local_d0.jstride * 8;
            lVar25 = lVar25 + lVar10;
            lVar18 = lVar18 + lVar10;
          }
          lVar12 = lVar12 + lVar19;
          lVar15 = lVar15 + local_d0.kstride * 8;
          lVar21 = lVar21 + lVar19;
          lVar24 = lVar24 + lVar11;
          lVar28 = lVar28 + lVar11;
        }
        lVar20 = lVar20 + local_110.nstride * 8;
        lVar17 = lVar17 + local_110.nstride * 8;
        lVar5 = lVar5 + local_d0.nstride * 8;
        lVar27 = lVar27 + local_150.nstride * 8;
        lVar23 = lVar23 + local_150.nstride * 8;
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    *a_time_avg = *a_time_avg + *a_dt_avg;
    if (compute_fluctuations == 1) {
      RVar30 = *a_time_avg_fluct + *a_dt_avg;
    }
    else {
      RVar30 = 0.0;
    }
    *a_time_avg_fluct = RVar30;
    *a_dt_avg = 0.0;
    return;
  }
  return;
}

Assistant:

void
NavierStokesBase::time_average(amrex::Real&  a_time_avg, amrex::Real&  a_time_avg_fluct, amrex::Real&  a_dt_avg, const Real& dt_level)

{
  a_dt_avg = a_dt_avg + dt_level;

  if (parent->levelSteps(0)%avg_interval == 0)
  {
    MultiFab& Sstate = get_new_data(State_Type);
    MultiFab& Savg   = get_new_data(Average_Type); 
    MultiFab& Savg_old   = get_old_data(Average_Type);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Savg,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       auto const& S_state = Sstate.array(mfi,Xvel);
       auto const& S_avg   = Savg.array(mfi);
       auto const& S_avg_old   = Savg_old.array(mfi);
       int loc_compute_fluctuations = compute_fluctuations; //NavierStokesBase class cannot be accessed directly fron device

       amrex::ParallelFor(bx, BL_SPACEDIM, [S_state, S_avg, S_avg_old, a_dt_avg, a_time_avg, loc_compute_fluctuations]
       AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
       {
          S_avg(i,j,k,n) = S_avg_old(i,j,k,n) + a_dt_avg * S_state(i,j,k,n);
          S_avg_old(i,j,k,n) = S_avg(i,j,k,n);

          if (loc_compute_fluctuations == 1){
            amrex::Real vel_prime = S_state(i,j,k,n) - (S_avg(i,j,k,n)/(a_time_avg + a_dt_avg));
            S_avg(i,j,k,n+BL_SPACEDIM) = S_avg_old(i,j,k,n+BL_SPACEDIM) + a_dt_avg * vel_prime * vel_prime;
          }
          else{
            S_avg(i,j,k,n+BL_SPACEDIM) = 0.;
          }
          S_avg_old(i,j,k,n+BL_SPACEDIM) = S_avg(i,j,k,n+BL_SPACEDIM);
       });
    }

    a_time_avg = a_time_avg + a_dt_avg;
    if (compute_fluctuations == 1){
      a_time_avg_fluct = a_time_avg_fluct + a_dt_avg;
    }else{
      a_time_avg_fluct = 0.;
    }

    a_dt_avg = 0;

  }
}